

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O2

void flatcc_json_printer_bool_enum_vector_field
               (flatcc_json_printer_t *ctx,flatcc_json_printer_table_descriptor_t *td,int id,
               char *name,size_t len,flatcc_json_printer_bool_enum_f *pf)

{
  char *pcVar1;
  uint *puVar2;
  ulong uVar3;
  int iVar4;
  flatbuffers_bool_t *pfVar5;
  bool bVar6;
  
  if (ctx->noenum != '\0') {
    flatcc_json_printer_bool_vector_field(ctx,td,id,name,len);
    return;
  }
  puVar2 = (uint *)get_field_ptr(td,id);
  if (puVar2 != (uint *)0x0) {
    iVar4 = td->count;
    td->count = iVar4 + 1;
    if (iVar4 != 0) {
      pcVar1 = ctx->p;
      ctx->p = pcVar1 + 1;
      *pcVar1 = ',';
    }
    uVar3 = (ulong)*puVar2;
    iVar4 = *(int *)((long)puVar2 + uVar3);
    print_name(ctx,name,len);
    ctx->level = ctx->level + 1;
    pcVar1 = ctx->p;
    ctx->p = pcVar1 + 1;
    *pcVar1 = '[';
    if (iVar4 == 0) {
      pfVar5 = (flatbuffers_bool_t *)((long)puVar2 + uVar3 + 4);
      iVar4 = 0;
    }
    else {
      if (ctx->indent == '\0') {
        flatcc_json_printer_flush_partial(ctx);
      }
      else {
        pcVar1 = ctx->p;
        ctx->p = pcVar1 + 1;
        *pcVar1 = '\n';
        print_indent(ctx);
      }
      (*pf)(ctx,*(flatbuffers_bool_t *)((long)puVar2 + uVar3 + 4));
      pfVar5 = (flatbuffers_bool_t *)((long)puVar2 + uVar3 + 5);
      iVar4 = iVar4 + -1;
    }
    while (bVar6 = iVar4 != 0, iVar4 = iVar4 + -1, bVar6) {
      pcVar1 = ctx->p;
      ctx->p = pcVar1 + 1;
      *pcVar1 = ',';
      if (ctx->indent == '\0') {
        flatcc_json_printer_flush_partial(ctx);
      }
      else {
        pcVar1 = ctx->p;
        ctx->p = pcVar1 + 1;
        *pcVar1 = '\n';
        print_indent(ctx);
      }
      (*pf)(ctx,*pfVar5);
      pfVar5 = pfVar5 + 1;
    }
    if (ctx->indent != '\0') {
      pcVar1 = ctx->p;
      ctx->p = pcVar1 + 1;
      *pcVar1 = '\n';
      ctx->level = ctx->level + -1;
      print_indent(ctx);
    }
    pcVar1 = ctx->p;
    ctx->p = pcVar1 + 1;
    *pcVar1 = ']';
  }
  return;
}

Assistant:

void flatcc_json_printer_struct_vector_field(flatcc_json_printer_t *ctx,
        flatcc_json_printer_table_descriptor_t *td,
        int id, const char *name, size_t len,
        size_t size,
        flatcc_json_printer_struct_f pf)
{
    const uint8_t *p = get_field_ptr(td, id);
    uoffset_t count;

    if (p) {
        if (td->count++) {
            print_char(',');
        }
        p = read_uoffset_ptr(p);
        count = __flatbuffers_uoffset_read_from_pe(p);
        p += uoffset_size;
        print_name(ctx, name, len);
        print_start('[');
        if (count) {
            print_nl();
            print_start('{');
            pf(ctx, p);
            print_end('}');
            --count;
        }
        while (count--) {
            p += size;
            print_char(',');
            print_nl();
            print_start('{');
            pf(ctx, p);
            print_end('}');
        }
        print_end(']');
    }
}